

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

void __thiscall QPDFJob::handleRotations(QPDFJob *this,QPDF *pdf)

{
  int iVar1;
  element_type *peVar2;
  pointer piVar3;
  _Rb_tree_node_base *p_Var4;
  ulong uVar5;
  ulong i;
  ulong uVar6;
  int *piVar7;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  QPDFPageDocumentHelper dh;
  vector<int,_std::allocator<int>_> local_80;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_68;
  QPDFPageDocumentHelper local_50;
  
  QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_50,pdf);
  QPDFPageDocumentHelper::getAllPages(&local_68,&local_50);
  i = ((long)local_68.
             super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>._M_impl
             .super__Vector_impl_data._M_finish -
       (long)local_68.
             super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>._M_impl
             .super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  if ((i & 0xffffffff80000000) != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(i);
  }
  peVar2 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = *(_Base_ptr *)((long)&(peVar2->rotations)._M_t._M_impl.super__Rb_tree_header + 0x10);
  do {
    if (p_Var4 == &(peVar2->rotations)._M_t._M_impl.super__Rb_tree_header._M_header) {
      std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_68);
      QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_50);
      return;
    }
    QUtil::parse_numrange(&local_80,*(char **)(p_Var4 + 1),(int)i);
    piVar3 = local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    for (piVar7 = local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar7 != piVar3; piVar7 = piVar7 + 1) {
      iVar1 = *piVar7;
      if ((0 < iVar1) && (iVar1 <= (int)i)) {
        uVar6 = (ulong)(iVar1 - 1);
        uVar5 = ((long)local_68.
                       super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_68.
                       super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
        if (uVar5 < uVar6 || uVar5 - uVar6 == 0) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        QPDFPageObjectHelper::rotatePage
                  (local_68.
                   super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar6,p_Var4[2]._M_color,
                   (bool)p_Var4[2].field_0x4);
      }
    }
    if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

void
QPDFJob::handleRotations(QPDF& pdf)
{
    QPDFPageDocumentHelper dh(pdf);
    std::vector<QPDFPageObjectHelper> pages = dh.getAllPages();
    int npages = QIntC::to_int(pages.size());
    for (auto const& iter: m->rotations) {
        std::string const& range = iter.first;
        QPDFJob::RotationSpec const& rspec = iter.second;
        // range has been previously validated
        for (int pageno_iter: QUtil::parse_numrange(range.c_str(), npages)) {
            int pageno = pageno_iter - 1;
            if ((pageno >= 0) && (pageno < npages)) {
                pages.at(QIntC::to_size(pageno)).rotatePage(rspec.angle, rspec.relative);
            }
        }
    }
}